

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

void P_CollectACSGlobalStrings(void)

{
  FACSStack *local_10;
  FACSStack *stack;
  
  for (local_10 = FACSStack::head; local_10 != (FACSStack *)0x0; local_10 = local_10->next) {
    ACSStringPool::MarkStringArray(&GlobalACSStrings,local_10->buffer,local_10->sp);
  }
  FBehavior::StaticMarkLevelVarStrings();
  P_MarkWorldVarStrings();
  P_MarkGlobalVarStrings();
  ACSStringPool::PurgeStrings(&GlobalACSStrings);
  return;
}

Assistant:

void P_CollectACSGlobalStrings()
{
	for (FACSStack *stack = FACSStack::head; stack != NULL; stack = stack->next)
	{
		GlobalACSStrings.MarkStringArray(stack->buffer, stack->sp);
	}
	FBehavior::StaticMarkLevelVarStrings();
	P_MarkWorldVarStrings();
	P_MarkGlobalVarStrings();
	GlobalACSStrings.PurgeStrings();
}